

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

BSDFSample * __thiscall
pbrt::HairBxDF::Sample_f
          (BSDFSample *__return_storage_ptr__,HairBxDF *this,Vector3f wo,Float uc,Point2f *u,
          TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  Float FVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  long lVar11;
  TransportMode mode_00;
  code *pcVar12;
  int p;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  Float FVar18;
  float fVar19;
  float fVar20;
  Float FVar21;
  float fVar22;
  Float FVar23;
  undefined1 auVar26 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar27 [16];
  undefined8 uVar24;
  undefined4 extraout_XMM0_Dc;
  ulong in_XMM0_Qb;
  undefined1 auVar28 [64];
  undefined1 auVar34 [56];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 in_register_00001384 [12];
  array<float,_4> aVar44;
  SampledSpectrum SVar45;
  Vector3f wi;
  array<float,_4> apPDF;
  float local_108;
  uint local_f8;
  uint uStack_d4;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  undefined1 local_a8 [16];
  undefined1 local_88 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  uint uStack_40;
  uint uStack_3c;
  float local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  undefined1 auVar25 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar40 [56];
  
  uVar24 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_c8 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_c4 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_c0 = (uint)in_XMM0_Qb;
  uStack_bc = (uint)(in_XMM0_Qb >> 0x20);
  auVar25 = vmaxss_avx(ZEXT416((uint)(1.0 - local_c8 * local_c8)),ZEXT816(0));
  pcVar12 = (code *)this;
  if (auVar25._0_4_ < 0.0) {
    auVar28._0_4_ = sqrtf(auVar25._0_4_);
    auVar28._4_60_ = extraout_var;
    auVar25 = auVar28._0_16_;
  }
  else {
    auVar25 = vsqrtss_avx(auVar25,auVar25);
  }
  auVar14._8_4_ = uStack_c0;
  auVar14._0_8_ = uVar24;
  auVar14._12_4_ = uStack_bc;
  auVar14 = vmovshdup_avx(auVar14);
  auVar40 = ZEXT856(auVar14._8_8_);
  fVar15 = atan2f(wo.super_Tuple3<pbrt::Vector3,_float>.z,auVar14._0_4_);
  uStack_d0 = auVar25._8_8_;
  auVar34 = ZEXT856(uStack_d0);
  FVar23 = auVar25._0_4_;
  aVar44 = ComputeApPDF(this,FVar23);
  auVar38._0_8_ = aVar44.values._8_8_;
  auVar38._8_56_ = auVar40;
  auVar29._0_8_ = aVar44.values._0_8_;
  auVar29._8_56_ = auVar34;
  local_58 = vmovlhps_avx(auVar29._0_16_,auVar38._0_16_);
  lVar11 = 0;
  fVar19 = 0.0;
  do {
    fVar19 = fVar19 + *(float *)(local_58 + lVar11);
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x10);
  lVar11 = 0;
  do {
    if (uc < *(float *)(local_58 + lVar11 * 4) / fVar19) goto LAB_00441327;
    uc = uc - *(float *)(local_58 + lVar11 * 4) / fVar19;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  lVar11 = 4;
LAB_00441327:
  if ((SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') &&
     (iVar10 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg
                                  ), iVar10 != 0)) {
    pcVar12 = SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
              {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__;
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg,
               SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
               {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
    __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x370) = *(long *)(in_FS_OFFSET + -0x370) + 1;
  if (lVar11 == 4) {
    *(long *)(in_FS_OFFSET + -0x378) = *(long *)(in_FS_OFFSET + -0x378) + 1;
    lVar11 = 3;
  }
  iVar10 = (int)lVar11;
  if (iVar10 == 2) {
    FVar18 = this->sin2kAlpha[2];
    FVar21 = this->cos2kAlpha[2];
  }
  else {
    if (iVar10 != 1) {
      local_a8._8_8_ = in_XMM0_Qb;
      local_a8._0_8_ = uVar24;
      FVar18 = FVar23;
      if (iVar10 == 0) {
        auVar5._8_4_ = uStack_c0;
        auVar5._0_8_ = uVar24;
        auVar5._12_4_ = uStack_bc;
        local_a8 = vfmsub231ss_fma(ZEXT416((uint)(this->sin2kAlpha[1] * FVar23)),auVar5,
                                   ZEXT416((uint)this->cos2kAlpha[1]));
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)(local_c8 * this->sin2kAlpha[1])),auVar25,
                                  ZEXT416((uint)this->cos2kAlpha[1]));
        FVar18 = auVar14._0_4_;
      }
      goto LAB_004413e8;
    }
    FVar18 = this->sin2kAlpha[0];
    FVar21 = this->cos2kAlpha[0];
  }
  auVar41._8_4_ = uStack_c0;
  auVar41._0_8_ = uVar24;
  auVar41._12_4_ = uStack_bc;
  local_a8 = vfmadd231ss_fma(ZEXT416((uint)(FVar23 * FVar18)),auVar41,ZEXT416((uint)FVar21));
  auVar14 = vfmsub231ss_fma(ZEXT416((uint)(FVar18 * local_c8)),auVar25,ZEXT416((uint)FVar21));
  FVar18 = auVar14._0_4_;
LAB_004413e8:
  fVar20 = *(float *)(local_58 + (long)iVar10 * 4);
  fVar16 = this->v[iVar10];
  local_48 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  auVar14 = vmaxss_avx(SUB6416(ZEXT464(0x3727c5ac),0),ZEXT416((uint)local_48));
  local_48 = 1.0 - local_48;
  auVar30._0_4_ = expf(-2.0 / fVar16);
  auVar30._4_60_ = extraout_var_00;
  auVar14 = vfmadd213ss_fma(auVar30._0_16_,ZEXT416((uint)local_48),ZEXT416(auVar14._0_4_));
  auVar31._0_4_ = logf(auVar14._0_4_);
  auVar31._4_60_ = extraout_var_01;
  auVar14 = vfmadd132ss_fma(auVar31._0_16_,SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar16));
  fVar16 = auVar14._0_4_;
  auVar13._0_12_ = ZEXT812(0);
  auVar13._12_4_ = 0;
  auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar16 * fVar16)),auVar13);
  if (auVar14._0_4_ < 0.0) {
    fVar43 = sqrtf(auVar14._0_4_);
  }
  else {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar43 = auVar14._0_4_;
  }
  fVar17 = cosf((u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855);
  auVar5 = vfnmadd132ss_fma(local_a8,ZEXT416((uint)(fVar17 * fVar43 * FVar18)),ZEXT416((uint)fVar16)
                           );
  fVar16 = auVar5._0_4_;
  auVar35._0_12_ = ZEXT812(0);
  auVar35._12_4_ = 0;
  auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar16 * fVar16)),auVar35);
  if (auVar14._0_4_ < 0.0) {
    FVar18 = sqrtf(auVar14._0_4_);
  }
  else {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    FVar18 = auVar14._0_4_;
  }
  auVar14 = vfmsub213ss_fma(ZEXT416((uint)this->eta),ZEXT416((uint)this->eta),
                            ZEXT416((uint)(local_c8 * local_c8)));
  auVar41 = ZEXT816(0) << 0x40;
  auVar14 = vmaxss_avx(auVar14,auVar41);
  if (auVar14._0_4_ < 0.0) {
    fVar43 = sqrtf(auVar14._0_4_);
    auVar41 = ZEXT816(0) << 0x40;
  }
  else {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar43 = auVar14._0_4_;
  }
  auVar13 = SUB6416(ZEXT464(0x3f7fffff),0);
  fVar43 = this->h / (fVar43 / FVar23);
  auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar43 * fVar43)),auVar41);
  if (auVar14._0_4_ < 0.0) {
    sqrtf(auVar14._0_4_);
    auVar13 = SUB6416(ZEXT464(0x3f7fffff),0);
  }
  auVar14 = vminss_avx(auVar13,ZEXT416((uint)(uc / (fVar20 / fVar19))));
  fVar19 = auVar14._0_4_;
  auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar43));
  uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar43),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar4 = (bool)((byte)uVar3 & 1);
  auVar32._0_4_ = asinf((float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar14._0_4_));
  auVar32._4_60_ = extraout_var_02;
  if (iVar10 < 3) {
    auVar42._0_4_ = (float)(iVar10 * 2);
    auVar42._4_12_ = in_register_00001384;
    fVar20 = this->s;
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(this->gamma_o * -2.0)),auVar32._0_16_,auVar42);
    auVar26._0_4_ = (float)iVar10;
    auVar26._4_12_ = in_register_00001384;
    auVar41 = vfmadd213ss_fma(auVar26,SUB6416(ZEXT464(0x40490fdb),0),auVar14);
    fVar43 = expf(3.1415927 / fVar20);
    fVar17 = expf(-3.1415927 / fVar20);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * (1.0 / (fVar17 + 1.0)))),
                              ZEXT416((uint)(1.0 - fVar19)),ZEXT416((uint)(1.0 / (fVar43 + 1.0))));
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar13 = vxorps_avx512vl(ZEXT416((uint)fVar20),auVar6);
    fVar19 = logf(1.0 / auVar14._0_4_ + -1.0);
    local_108 = auVar13._0_4_;
    auVar14 = vminss_avx(SUB6416(ZEXT464(0x40490fdb),0),ZEXT416((uint)(fVar19 * local_108)));
    uVar3 = vcmpss_avx512f(ZEXT416((uint)(fVar19 * local_108)),SUB6416(ZEXT464(0xc0490fdb),0),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar19 = (float)((uint)bVar4 * -0x3fb6f025 + (uint)!bVar4 * auVar14._0_4_) + auVar41._0_4_;
  }
  else {
    fVar19 = fVar19 * 6.2831855;
  }
  fVar20 = cosf(fVar19 + fVar15);
  fVar15 = sinf(fVar19 + fVar15);
  local_48 = -local_c8;
  fStack_44 = -fStack_c4;
  uStack_40 = uStack_c0 ^ 0x80000000;
  uStack_3c = uStack_bc ^ 0x80000000;
  uStack_d4 = auVar25._4_4_;
  uStack_d0._0_4_ = auVar25._8_4_;
  uStack_d0._4_4_ = auVar25._12_4_;
  local_38 = -FVar23;
  uStack_34 = uStack_d4 ^ 0x80000000;
  uStack_30 = (uint)uStack_d0 ^ 0x80000000;
  uStack_2c = uStack_d0._4_4_ ^ 0x80000000;
  local_f8 = 0;
  lVar11 = 0;
  do {
    iVar10 = (int)lVar11;
    if (iVar10 == 2) {
      FVar21 = this->sin2kAlpha[2];
      FVar1 = this->cos2kAlpha[2];
LAB_004417b9:
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(FVar23 * FVar21)),ZEXT416((uint)FVar1),
                                ZEXT416((uint)local_c8));
      fVar43 = auVar14._0_4_;
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(FVar21 * local_48)),auVar25,ZEXT416((uint)FVar1));
    }
    else {
      if (iVar10 == 1) {
        FVar21 = this->sin2kAlpha[0];
        FVar1 = this->cos2kAlpha[0];
        goto LAB_004417b9;
      }
      auVar14 = auVar25;
      fVar43 = local_c8;
      if (iVar10 == 0) {
        auVar9._8_4_ = uStack_c0;
        auVar9._0_8_ = uVar24;
        auVar9._12_4_ = uStack_bc;
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)(this->sin2kAlpha[1] * local_38)),auVar9,
                                  ZEXT416((uint)this->cos2kAlpha[1]));
        fVar43 = auVar14._0_4_;
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)(local_c8 * this->sin2kAlpha[1])),
                                  ZEXT416((uint)this->cos2kAlpha[1]),ZEXT416((uint)FVar23));
      }
    }
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(auVar14,auVar7);
    FVar21 = Mp(FVar18,auVar14._0_4_,fVar16,fVar43,this->v[lVar11]);
    auVar36._0_4_ = (float)(iVar10 * 2);
    auVar36._4_12_ = in_register_00001384;
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(this->gamma_o * -2.0)),auVar36,
                              ZEXT416((uint)auVar32._0_4_));
    auVar37._0_4_ = (float)iVar10;
    auVar37._4_12_ = in_register_00001384;
    auVar14 = vfmadd213ss_fma(auVar37,SUB6416(ZEXT464(0x40490fdb),0),auVar14);
    for (fVar43 = fVar19 - auVar14._0_4_; 3.1415927 < fVar43; fVar43 = fVar43 + -6.2831855) {
    }
    fVar17 = *(float *)(local_58 + lVar11 * 4);
    fVar2 = this->s;
    for (; fVar43 < -3.1415927; fVar43 = fVar43 + 6.2831855) {
    }
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar14 = vorps_avx512vl(ZEXT416((uint)fVar43),auVar8);
    fVar43 = auVar14._0_4_ / fVar2;
    local_88._0_4_ = expf(fVar43);
    local_88._4_4_ = extraout_XMM0_Db;
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._12_4_ = extraout_XMM0_Dd;
    fVar43 = expf(fVar43);
    fVar22 = expf(-3.1415927 / fVar2);
    auVar41 = vinsertps_avx(ZEXT416((uint)(fVar2 * (fVar43 + 1.0) * (fVar43 + 1.0))),
                            ZEXT416((uint)(fVar22 + 1.0)),0x10);
    auVar14 = vblendps_avx(local_88,_DAT_004b90a0,0xe);
    auVar14 = vdivps_avx(auVar14,auVar41);
    fVar43 = expf(3.1415927 / fVar2);
    mode_00 = (TransportMode)pcVar12;
    auVar41 = vmovshdup_avx(auVar14);
    auVar27._0_4_ = auVar14._0_4_ / (auVar41._0_4_ - 1.0 / (fVar43 + 1.0));
    auVar27._4_12_ = auVar14._4_12_;
    auVar14 = vfmadd231ss_fma(ZEXT416(local_f8),auVar27,ZEXT416((uint)(FVar21 * fVar17)));
    local_f8 = auVar14._0_4_;
    lVar11 = lVar11 + 1;
    if (lVar11 == 3) {
      FVar23 = Mp(FVar18,FVar23,fVar16,local_c8,this->v[3]);
      auVar41 = vfmadd231ss_fma(ZEXT416(local_f8),ZEXT416((uint)(FVar23 * (float)local_58._12_4_)),
                                ZEXT416(0x3e22f983));
      auVar25 = vinsertps_avx(auVar5,ZEXT416((uint)(FVar18 * fVar20)),0x10);
      auVar40 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar34 = ZEXT856(in_XMM0_Qb);
      wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar25._0_8_;
      wi.super_Tuple3<pbrt::Vector3,_float>.z = FVar18 * fVar15;
      SVar45 = f(this,wo,wi,mode_00);
      auVar39._0_8_ = SVar45.values.values._8_8_;
      auVar39._8_56_ = auVar40;
      auVar33._0_8_ = SVar45.values.values._0_8_;
      auVar33._8_56_ = auVar34;
      auVar14 = vmovlhps_avx(auVar33._0_16_,auVar39._0_16_);
      *(undefined1 (*) [16])(__return_storage_ptr__->f).values.values = auVar14;
      uVar24 = vmovlps_avx(auVar25);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar24;
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar24 >> 0x20);
      (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = FVar18 * fVar15;
      __return_storage_ptr__->pdf = auVar41._0_4_;
      __return_storage_ptr__->flags = GlossyReflection;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

BSDFSample HairBxDF::Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                              BxDFReflTransFlags sampleFlags) const {
    // Compute hair coordinate system terms related to _wo_
    Float sinTheta_o = wo.x;
    Float cosTheta_o = SafeSqrt(1 - Sqr(sinTheta_o));
    Float phi_o = std::atan2(wo.z, wo.y);

    // Determine which term $p$ to sample for hair scattering
    pstd::array<Float, pMax + 1> apPDF = ComputeApPDF(cosTheta_o);
    int p = SampleDiscrete(apPDF, uc, nullptr, &uc);

    // Rotate $\sin \thetao$ and $\cos \thetao$ to account for hair scale tilt
    Float sinThetap_o, cosThetap_o;
    if (p == 0) {
        sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
        cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
    } else if (p == 1) {
        sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
        cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
    } else if (p == 2) {
        sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
        cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
    } else {
        sinThetap_o = sinTheta_o;
        cosThetap_o = cosTheta_o;
    }

    // Sample $M_p$ to compute $\thetai$
    Float cosTheta = 1 + v[p] * std::log(std::max<Float>(u[0], 1e-5) +
                                         (1 - u[0]) * std::exp(-2 / v[p]));
    Float sinTheta = SafeSqrt(1 - Sqr(cosTheta));
    Float cosPhi = std::cos(2 * Pi * u[1]);
    Float sinTheta_i = -cosTheta * sinThetap_o + sinTheta * cosPhi * cosThetap_o;
    Float cosTheta_i = SafeSqrt(1 - Sqr(sinTheta_i));

    // Sample $N_p$ to compute $\Delta\phi$
    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float cosGamma_t = SafeSqrt(1 - Sqr(sinGamma_t));
    Float gamma_t = SafeASin(sinGamma_t);

    Float dphi;
    if (p < pMax)
        dphi = Phi(p, gamma_o, gamma_t) + SampleTrimmedLogistic(uc, s, -Pi, Pi);
    else
        dphi = 2 * Pi * uc;

    // Compute _wi_ from sampled hair scattering angles
    Float phi_i = phi_o + dphi;
    Vector3f wi(sinTheta_i, cosTheta_i * std::cos(phi_i), cosTheta_i * std::sin(phi_i));

    // Compute PDF for sampled hair scattering direction _wi_
    Float pdf = 0;
    for (int p = 0; p < pMax; ++p) {
        // Rotate $\sin \thetao$ and $\cos \thetao$ to account for hair scale tilt
        Float sinThetap_o, cosThetap_o;
        if (p == 0) {
            sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
            cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
        } else if (p == 1) {
            sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
            cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
        } else if (p == 2) {
            sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
            cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
        } else {
            sinThetap_o = sinTheta_o;
            cosThetap_o = cosTheta_o;
        }

        // Handle out-of-range $\cos \thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);

        pdf += Mp(cosTheta_i, cosThetap_o, sinTheta_i, sinThetap_o, v[p]) * apPDF[p] *
               Np(dphi, p, s, gamma_o, gamma_t);
    }
    pdf += Mp(cosTheta_i, cosTheta_o, sinTheta_i, sinTheta_o, v[pMax]) * apPDF[pMax] *
           (1 / (2 * Pi));
    // if (std::abs(wi->x) < .9999) CHECK_NEAR(*pdf, PDF(wo, *wi), .01);

    return BSDFSample(f(wo, wi, mode), wi, pdf, Flags());
}